

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::BasicTexSubImage2DCase::createTexture(BasicTexSubImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 type;
  uint uVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  uint uVar9;
  int iVar10;
  int ndx;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  float fVar15;
  int local_110;
  deUint32 tex;
  Vec4 gMax;
  Vec4 gMin;
  PixelBufferAccess local_b8;
  float local_88 [6];
  TextureFormat fmt;
  Random rnd;
  TextureLevel data;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  local_110 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar13 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar9 = 0x20;
    if (uVar13 != 0) {
      uVar9 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = uVar9 ^ 0x1f;
    }
    uVar13 = (this->super_TextureSpecCase).m_height;
    if (uVar13 != 0) {
      uVar3 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    local_110 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar9)) {
      local_110 = 0x1f - uVar9;
    }
    local_110 = local_110 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  if (local_110 != 0) {
    iVar14 = 0;
    do {
      iVar12 = (this->super_TextureSpecCase).m_width >> ((byte)iVar14 & 0x1f);
      iVar10 = (this->super_TextureSpecCase).m_height >> ((byte)iVar14 & 0x1f);
      local_b8.super_ConstPixelBufferAccess.m_format.order = R;
      local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      if (iVar12 < 2) {
        iVar12 = 1;
      }
      gMax.m_data[0] = 1.0;
      gMax.m_data[1] = 1.0;
      gMax.m_data[2] = 1.0;
      gMax.m_data[3] = 1.0;
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar11 = 0;
      do {
        fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2];
        fVar2 = gMax.m_data[lVar11];
        fVar15 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar11] = (fVar2 - fVar1) * fVar15 + fVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      local_b8.super_ConstPixelBufferAccess.m_format.order = R;
      local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      local_88[0] = 1.0;
      local_88[1] = 1.0;
      local_88[2] = 1.0;
      local_88[3] = 1.0;
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar11 = 0;
      do {
        fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2];
        fVar2 = local_88[lVar11];
        fVar15 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar11] = (fVar2 - fVar1) * fVar15 + fVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      tcu::TextureLevel::setSize(&data,iVar12,iVar10,1);
      tcu::TextureLevel::getAccess(&local_b8,&data);
      tcu::fillWithComponentGradients(&local_b8,&gMin,&gMax);
      dVar4 = this->m_format;
      dVar5 = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_b8,&data);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,iVar14,dVar4,iVar12,iVar10,0,dVar4,dVar5,
                 local_b8.super_ConstPixelBufferAccess.m_data);
      iVar14 = iVar14 + 1;
    } while (iVar14 != local_110);
    iVar14 = 0;
    do {
      uVar13 = (this->super_TextureSpecCase).m_width >> ((byte)iVar14 & 0x1f);
      if ((int)uVar13 < 2) {
        uVar13 = 1;
      }
      uVar9 = (this->super_TextureSpecCase).m_height >> ((byte)iVar14 & 0x1f);
      if ((int)uVar9 < 2) {
        uVar9 = 1;
      }
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      iVar10 = dVar4 % uVar13 + 1;
      iVar12 = dVar5 % uVar9 + 1;
      local_b8.super_ConstPixelBufferAccess.m_format.order = R;
      local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      gMax.m_data[0] = 1.0;
      gMax.m_data[1] = 1.0;
      gMax.m_data[2] = 1.0;
      gMax.m_data[3] = 1.0;
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar11 = 0;
      do {
        fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2];
        fVar2 = gMax.m_data[lVar11];
        fVar15 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar11] = (fVar2 - fVar1) * fVar15 + fVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      local_b8.super_ConstPixelBufferAccess.m_format.order = R;
      local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      local_88[0] = 1.0;
      local_88[1] = 1.0;
      local_88[2] = 1.0;
      local_88[3] = 1.0;
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar11 = 0;
      do {
        fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2];
        fVar2 = local_88[lVar11];
        fVar15 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar11] = (fVar2 - fVar1) * fVar15 + fVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      dVar8 = deRandom_getUint32(&rnd.m_rnd);
      tcu::TextureLevel::setSize(&data,iVar10,iVar12,1);
      tcu::TextureLevel::getAccess(&local_b8,&data);
      tcu::fillWithGrid(&local_b8,dVar8 % 0xf + 2,&gMin,&gMax);
      dVar8 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_b8,&data);
      sglr::ContextWrapper::glTexSubImage2D
                (this_00,0xde1,iVar14,dVar6 % (uVar13 - dVar4 % uVar13),
                 dVar7 % (uVar9 - dVar5 % uVar9),iVar10,iVar12,dVar8,type,
                 local_b8.super_ConstPixelBufferAccess.m_data);
      iVar14 = iVar14 + 1;
    } while (iVar14 != local_110);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		x			= rnd.getInt(0, levelW-w);
			int		y			= rnd.getInt(0, levelH-h);

			Vec4	colorA		= randomVector<4>(rnd);
			Vec4	colorB		= randomVector<4>(rnd);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(w, h);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, x, y, w, h, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}